

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O1

void __thiscall
squall::detail::KlassImp<Foo>::KlassImp(KlassImp<Foo> *this,HSQUIRRELVM vm,string *name)

{
  pointer pcVar1;
  SQInteger newtop;
  HSQOBJECT HVar2;
  HSQOBJECT table;
  keeper k;
  
  (this->super_KlassImpBase)._vptr_KlassImpBase = (_func_int **)&PTR__KlassImp_0013f3e8;
  this->vm_ = vm;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->closed_ = false;
  HVar2 = make_accessor_table(this);
  (this->getter_table_)._type = HVar2._type;
  (this->getter_table_)._unVal.nInteger = (SQInteger)HVar2._unVal;
  HVar2 = make_accessor_table(this);
  (this->setter_table_)._type = HVar2._type;
  (this->setter_table_)._unVal.nInteger = (SQInteger)HVar2._unVal;
  newtop = sq_gettop(vm);
  sq_newclass(vm,0);
  sq_getstackobj(vm,-1,&this->sqclass_);
  sq_addref(vm,&this->sqclass_);
  HVar2._4_4_ = 0;
  HVar2._type = (this->getter_table_)._type;
  HVar2._unVal.pTable = (this->getter_table_)._unVal.pTable;
  defmetamethod(this,"_get",HVar2,delegate_get);
  table._4_4_ = 0;
  table._type = (this->setter_table_)._type;
  table._unVal.pTable = (this->setter_table_)._unVal.pTable;
  defmetamethod(this,"_set",table,delegate_set);
  sq_settop(vm,newtop);
  return;
}

Assistant:

KlassImp(HSQUIRRELVM vm, const string& name)
        : vm_(vm), name_(name), closed_(false) {
        
        make_getter_table();
        make_setter_table();
        
        keeper k(vm);
        sq_newclass(vm, SQFalse);
        sq_getstackobj(vm, -1, &sqclass_);
        sq_addref(vm, &sqclass_);

        defmetamethod(_SC("_get"), getter_table_, delegate_get);
        defmetamethod(_SC("_set"), setter_table_, delegate_set);
    }